

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_message.cpp
# Opt level: O1

FieldDef * __thiscall
bidfx_public_api::price::pixie::DataDictionaryMessage::ReadFieldDef
          (FieldDef *__return_storage_ptr__,DataDictionaryMessage *this,ByteBuffer *buffer)

{
  FieldTypeEnum type;
  FieldEncodingEnum encoding;
  uint32_t fid;
  uint uVar1;
  uint32_t scale;
  InputStream *stream;
  string name;
  string local_70;
  string local_50;
  
  fid = tools::Varint::ReadU32(&buffer->super_InputStream);
  uVar1 = (**(buffer->super_InputStream)._vptr_InputStream)(buffer);
  type = FieldTypeMethods::ValueOf(uVar1 & 0xff);
  uVar1 = (**(buffer->super_InputStream)._vptr_InputStream)(buffer);
  encoding = FieldEncodingMethods::ValueOf(uVar1 & 0xff);
  scale = tools::Varint::ReadU32(&buffer->super_InputStream);
  tools::Varint::ReadString_abi_cxx11_(&local_50,(Varint *)buffer,stream);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  FieldDef::FieldDef(__return_storage_ptr__,fid,type,&local_70,encoding,scale);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

FieldDef DataDictionaryMessage::ReadFieldDef(ByteBuffer& buffer)
{
    int fid = Varint::ReadU32(buffer);
    FieldTypeEnum field_type = FieldTypeMethods::ValueOf(buffer.ReadByte());
    FieldEncodingEnum encoding = FieldEncodingMethods::ValueOf(buffer.ReadByte());
    int scale =  Varint::ReadU32(buffer);
    std::string name = Varint::ReadString(buffer);

    return FieldDef(fid, field_type, name, encoding, scale);
}